

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

void __thiscall Messages::AddressBook::MergeFrom(AddressBook *this,AddressBook *from)

{
  LogMessage *pLVar1;
  Container<google::protobuf::UnknownFieldSet> *pCVar2;
  undefined1 *this_00;
  LogFinisher local_ad;
  uint32 cached_has_bits;
  byte local_99;
  LogMessage local_98 [56];
  AddressBook *local_60;
  AddressBook *from_local;
  AddressBook *this_local;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  UnknownFieldSet *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  
  local_99 = 0;
  local_60 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O0/proto/messages.pb.cc"
               ,0x3ce);
    local_99 = 1;
    pLVar1 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_98,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_ad,pLVar1);
  }
  if ((local_99 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(local_98);
  }
  this_00 = &this->field_0x8;
  this_local = (AddressBook *)&local_60->field_0x8;
  local_48 = this_00;
  local_40 = (undefined1 *)this_local;
  local_10 = (undefined1 *)this_local;
  if (((uint)*(undefined8 *)this_local & 1) == 1) {
    local_38 = 0;
    local_30 = (undefined1 *)this_local;
    local_20 = (undefined1 *)this_local;
    local_18 = (undefined1 *)this_local;
    if (((uint)*(undefined8 *)this_local & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                         ((InternalMetadata *)this_local);
      local_28 = &pCVar2->unknown_fields;
    }
    else {
      local_28 = (UnknownFieldSet *)(*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)this_00,local_28);
  }
  google::protobuf::RepeatedPtrField<Messages::Person>::MergeFrom(&this->people_,&local_60->people_)
  ;
  return;
}

Assistant:

void AddressBook::MergeFrom(const AddressBook& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:Messages.AddressBook)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  people_.MergeFrom(from.people_);
}